

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O0

void close_socket(cio_socket *socket)

{
  cio_socket *socket_local;
  
  cio_linux_eventloop_unregister_read((socket->impl).loop,&(socket->impl).ev);
  cio_linux_eventloop_remove((socket->impl).loop,&(socket->impl).ev);
  cio_timer_close(&(socket->impl).close_timer);
  close_and_call_hook(socket);
  return;
}

Assistant:

static void close_socket(struct cio_socket *socket)
{
	cio_linux_eventloop_unregister_read(socket->impl.loop, &socket->impl.ev);
	cio_linux_eventloop_remove(socket->impl.loop, &socket->impl.ev);

	cio_timer_close(&socket->impl.close_timer);
	close_and_call_hook(socket);
}